

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_image.c
# Opt level: O0

void aom_img_metadata_array_free(aom_metadata_array_t *arr)

{
  ulong *in_RDI;
  size_t i;
  ulong local_10;
  
  if (in_RDI != (ulong *)0x0) {
    if (in_RDI[1] != 0) {
      for (local_10 = 0; local_10 < *in_RDI; local_10 = local_10 + 1) {
        aom_img_metadata_free((aom_metadata_t *)0x1a006c);
      }
      free((void *)in_RDI[1]);
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void aom_img_metadata_array_free(aom_metadata_array_t *arr) {
  if (arr) {
    if (arr->metadata_array) {
      for (size_t i = 0; i < arr->sz; i++) {
        aom_img_metadata_free(arr->metadata_array[i]);
      }
      free(arr->metadata_array);
    }
    free(arr);
  }
}